

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.h
# Opt level: O0

void lscpp::protocol::serializer_impl_::from_optional<std::variant<int,std::__cxx11::string>>
               (json *j,string *key,
               optional<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *to)

{
  bool bVar1;
  const_reference this;
  undefined1 local_48 [8];
  variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> v;
  optional<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *to_local;
  string *key_local;
  json *j_local;
  
  v.
  super__Variant_base<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .super__Move_assign_alias<int,_std::__cxx11::basic_string<char>_>.
  super__Copy_assign_alias<int,_std::__cxx11::basic_string<char>_>.
  super__Move_ctor_alias<int,_std::__cxx11::basic_string<char>_>.
  super__Copy_ctor_alias<int,_std::__cxx11::basic_string<char>_>.
  super__Variant_storage_alias<int,_std::__cxx11::basic_string<char>_>._32_8_ = to;
  bVar1 = nlohmann::json_abi_v3_11_2::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::contains(j,key);
  if (bVar1) {
    std::
    variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    variant((variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)local_48);
    this = nlohmann::json_abi_v3_11_2::
           basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
           ::operator[](j,key);
    nlohmann::json_abi_v3_11_2::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::
    get_to<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_0>
              (this,(variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)local_48);
    std::optional<std::variant<int,std::__cxx11::string>>::operator=
              ((optional<std::variant<int,std::__cxx11::string>> *)
               v.
               super__Variant_base<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               .super__Move_assign_alias<int,_std::__cxx11::basic_string<char>_>.
               super__Copy_assign_alias<int,_std::__cxx11::basic_string<char>_>.
               super__Move_ctor_alias<int,_std::__cxx11::basic_string<char>_>.
               super__Copy_ctor_alias<int,_std::__cxx11::basic_string<char>_>.
               super__Variant_storage_alias<int,_std::__cxx11::basic_string<char>_>._32_8_,
               (variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_48);
    std::
    variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~variant((variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_48);
  }
  return;
}

Assistant:

void from_optional(const nlohmann::json &j, std::string const &key,
                   std::optional<T> &to) {
  if (j.contains(key)) {
    T v;
    j[key].get_to(v);
    to = v;
  }
}